

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O0

void dict_free(dict_t *d)

{
  dictword_t *pdVar1;
  dictword_t *word;
  int i;
  dict_t *d_local;
  
  if (d != (dict_t *)0x0) {
    for (word._4_4_ = 0; word._4_4_ < d->n_word; word._4_4_ = word._4_4_ + 1) {
      pdVar1 = d->word + word._4_4_;
      if (pdVar1->word != (char *)0x0) {
        ckd_free(pdVar1->word);
      }
      if (pdVar1->ciphone != (s3cipid_t *)0x0) {
        ckd_free(pdVar1->ciphone);
      }
    }
    if (d->word != (dictword_t *)0x0) {
      ckd_free(d->word);
    }
    for (word._4_4_ = 0; word._4_4_ < d->n_ciphone; word._4_4_ = word._4_4_ + 1) {
      if (d->ciphone_str[word._4_4_] != (char *)0x0) {
        ckd_free(d->ciphone_str[word._4_4_]);
      }
    }
    if (d->ciphone_str != (char **)0x0) {
      ckd_free(d->ciphone_str);
    }
    if (d->pht != (hash_table_t *)0x0) {
      hash_table_free(d->pht);
    }
    if (d->ht != (hash_table_t *)0x0) {
      hash_table_free(d->ht);
    }
    ckd_free(d);
  }
  return;
}

Assistant:

void
dict_free(dict_t * d)
{
    int i;
    dictword_t *word;

    if (d) {                    /* Clean up the dictionary stuff */
        /* First Step, free all memory allocated for each word */
        for (i = 0; i < d->n_word; i++) {
            word = (dictword_t *) & (d->word[i]);
            if (word->word)
                ckd_free((void *) word->word);
            if (word->ciphone)
                ckd_free((void *) word->ciphone);
        }

        if (d->word)
            ckd_free((void *) d->word);
        for (i = 0; i < d->n_ciphone; i++) {
            if (d->ciphone_str[i])
                ckd_free((void *) d->ciphone_str[i]);
        }
        if (d->ciphone_str)
            ckd_free((void *) d->ciphone_str);
        if (d->pht)
            hash_table_free(d->pht);
        if (d->ht)
            hash_table_free(d->ht);
        ckd_free((void *) d);
    }
}